

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

int get_physical_address
              (CPURISCVState_conflict1 *env,hwaddr *physical,int *prot,target_ulong addr,
              int access_type,int mmu_idx,_Bool first_stage,_Bool two_stage)

{
  byte bVar1;
  char cVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  MemoryRegion_conflict *pMVar8;
  uint64_t *puVar9;
  bool bVar10;
  uint uVar11;
  target_ulong *ptVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  target_ulong addr_00;
  int iVar17;
  long lVar18;
  ulong uVar19;
  MemTxAttrs attrs;
  bool bVar20;
  int local_e0;
  target_ulong local_c0;
  hwaddr vbase;
  uint local_a4;
  int local_a0;
  MemTxResult res;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  uint64_t local_80;
  ulong local_78;
  hwaddr *local_70;
  ulong local_68;
  undefined8 local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  hwaddr addr1;
  
  if (access_type == 2 || mmu_idx != 3) {
    uVar16 = 0;
    local_a4 = mmu_idx;
  }
  else {
    uVar16 = env->mstatus;
    if (((uint)uVar16 >> 0x11 & 1) == 0) {
      local_a4 = 3;
    }
    else {
      local_a4 = (uint)(uVar16 >> 0xb) & 3;
      if ((env->misa & 0x80) != 0) {
        uVar16 = uVar16 >> 0x27;
        goto LAB_00c73e51;
      }
    }
    uVar16 = 0;
  }
LAB_00c73e51:
  if ((((access_type != 2) && (local_a4 == 1)) && (local_a4 = 1, (env->misa & 0x80) != 0)) &&
     (((env->virt & 1) == 0 && ((env->hstatus & 1) != 0)))) {
    local_a4 = (uint)env->mstatus >> 8 & 1;
    uVar16 = 1;
  }
  iVar4 = 0;
  if (!first_stage) {
    local_a4 = 0;
  }
  if ((local_a4 == 3) || ((env->features & 1) == 0)) {
LAB_00c73eae:
    *physical = addr;
    *prot = 7;
  }
  else {
    ptVar12 = &env->vsstatus;
    if (first_stage) {
      ptVar12 = &env->mstatus;
    }
    *prot = 0;
    if (0x10fff < env->priv_ver) {
      lVar13 = 0x2a0;
      if ((uVar16 & 1) != 0) {
        lVar13 = 0x368;
      }
      lVar18 = 0x328;
      if (first_stage) {
        lVar18 = lVar13;
      }
      uVar16 = *(ulong *)((long)env->gpr + lVar18);
      if ((uint)(uVar16 >> 0x3c) < 0xb) {
        iVar4 = (*(code *)(&DAT_00dc48cc + *(int *)(&DAT_00dc48cc + (uVar16 >> 0x3c) * 4)))
                          (&DAT_00dc48cc + *(int *)(&DAT_00dc48cc + (uVar16 >> 0x3c) * 4));
        return iVar4;
      }
      iVar4 = 0x17f;
      goto LAB_00c7446b;
    }
    local_c0 = env->sptbr << 0xc;
    uVar6 = (uint)env->mstatus;
    uVar11 = uVar6 >> 0x18 & 0x1f;
    if (uVar11 < 9) {
      if (uVar11 == 0) goto LAB_00c73eae;
      if (uVar11 != 8) {
LAB_00c73fe3:
        iVar4 = 0x192;
LAB_00c7446b:
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                   ,iVar4,(char *)0x0);
      }
      local_60 = 2;
      iVar4 = 10;
      lVar13 = 4;
    }
    else {
      if (uVar11 == 10) {
        local_60 = 4;
      }
      else {
        if (uVar11 != 9) goto LAB_00c73fe3;
        local_60 = 3;
      }
      iVar4 = 9;
      lVar13 = 8;
    }
    cVar2 = (char)local_60 * (sbyte)iVar4;
    uVar16 = ~(-1L << (0x35U - cVar2 & 0x3f));
    uVar19 = addr >> (cVar2 + 0xbU & 0x3f) & uVar16;
    if (uVar19 == 0 || uVar19 == uVar16) {
      uVar11 = (uint)*ptVar12 >> 0x13;
      uVar14 = ((int)local_60 + -1) * iVar4;
      bVar10 = access_type == 2 || (uVar6 >> 0x12 & 1) != 0;
      local_90 = (ulong)bVar10;
      local_68 = (ulong)(access_type == 1) << 7 | 0x40;
      local_78 = addr >> 0xc;
      iVar17 = 0;
      local_a0 = mmu_idx;
      local_70 = physical;
      local_58 = addr;
      do {
        local_48 = (ulong)uVar14;
        bVar1 = (byte)uVar14;
        local_40 = local_58 >> (bVar1 + 0xc & 0x3f);
        local_88 = ~(-1L << (bVar1 & 0x3f));
        local_50 = ~(-1L << (bVar1 & 0x3f));
        do {
          iVar5 = iVar17;
          uVar16 = (ulong)(~(-1 << (sbyte)iVar4) & (uint)local_40);
          if (first_stage && two_stage) {
            get_physical_address(env,&vbase,prot,local_c0,access_type,local_a0,false,true);
            addr_00 = uVar16 * lVar13 + vbase;
          }
          else {
            addr_00 = uVar16 * lVar13 + local_c0;
          }
          if ((env->features & 2) != 0) {
            _Var3 = pmp_hart_has_privs_riscv64((CPURISCVState_conflict2 *)env,addr_00,8,PMP_READ,1);
            if (_Var3) goto LAB_00c741c0;
            local_e0 = 2;
            iVar15 = 1;
            goto LAB_00c74210;
          }
LAB_00c741c0:
          iVar17 = 1;
          uVar7 = address_space_ldq_riscv64
                            ((uc_struct_conflict13 *)((AddressSpace *)env[-0x17].gpr[0x1d])->uc,
                             (AddressSpace *)env[-0x17].gpr[0x1d],addr_00,(MemTxAttrs)0x1,&res);
          if ((res == 0) && ((uVar7 & 1) != 0)) {
            uVar6 = (uint)uVar7 & 0xe;
            if ((uVar6 == 0xc) || (uVar6 == 4)) goto LAB_00c741f6;
            uVar16 = uVar7 >> 10;
            if ((uVar7 & 0xe) == 0) {
              local_c0 = uVar16 << 0xc;
              iVar15 = 0;
            }
            else {
              if (((((((bVar10 & (byte)(((uint)uVar7 & 0x10) >> 4) & local_a4 != 0) != 0) ||
                     (local_a4 != 1 && (uVar7 & 0x10) == 0)) || ((uVar16 & local_88) != 0)) ||
                   (((access_type == 0 && ((uVar7 & 2) == 0)) &&
                    (((uVar7 & 8) == 0 || ((uVar11 & 1) == 0)))))) ||
                  ((access_type == 1 && ((uVar7 & 4) == 0)))) ||
                 ((access_type == 2 && ((uVar7 & 8) == 0)))) goto LAB_00c741f6;
              if ((local_68 | uVar7) != uVar7) {
                vbase = 8;
                attrs = (MemTxAttrs)(((uint)local_90 & 0xff800000) + 1);
                local_90 = (ulong)(uint)attrs;
                local_98 = uVar16;
                local_80 = local_68 | uVar7;
                pMVar8 = flatview_translate_riscv64
                                   (*(uc_struct_conflict13 **)(env[-0x17].gpr[0x1d] + 0x30),
                                    *(FlatView **)(env[-0x17].gpr[0x1d] + 8),addr_00,&addr1,&vbase,
                                    false,attrs);
                iVar15 = 1;
                if (pMVar8->ram == true) {
                  puVar9 = (uint64_t *)
                           qemu_map_ram_ptr_riscv64
                                     ((uc_struct_conflict13 *)pMVar8->uc,pMVar8->ram_block,addr1);
                  LOCK();
                  bVar20 = uVar7 == *puVar9;
                  if (bVar20) {
                    *puVar9 = local_80;
                  }
                  UNLOCK();
                  if (bVar20) {
                    uVar7 = local_80;
                  }
                  iVar15 = (uint)!bVar20 << 3;
                }
                else {
                  local_e0 = 1;
                }
                uVar16 = local_98;
                if (iVar15 != 0) goto LAB_00c74210;
              }
              uVar19 = local_88;
              if (iVar5 == 0) {
                uVar19 = local_50;
              }
              *local_70 = (uVar16 | uVar19 & local_78) << 0xc;
              if (((uVar7 & 2) != 0) || (((uVar7 & 8) != 0 && ((uVar11 & 1) != 0)))) {
                *(byte *)prot = (byte)*prot | 1;
              }
              if ((uVar7 & 8) != 0) {
                *(byte *)prot = (byte)*prot | 4;
              }
              local_e0 = 0;
              iVar15 = iVar17;
              if (((uVar7 & 4) != 0) && ((access_type == 1 || ((uVar7 & 0x80) != 0)))) {
                *(byte *)prot = (byte)*prot | 2;
              }
            }
          }
          else {
LAB_00c741f6:
            local_e0 = 1;
            iVar15 = iVar17;
          }
LAB_00c74210:
          iVar17 = 0;
        } while (iVar15 == 8);
        if (iVar15 != 0) {
          return local_e0;
        }
        iVar17 = iVar5 + 1;
        uVar14 = (int)local_48 - iVar4;
      } while (iVar17 != (int)local_60);
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int get_physical_address(CPUMIPSState *env, hwaddr *physical,
                                int *prot, target_ulong real_address,
                                int rw, int access_type, int mmu_idx)
{
    /* User mode can only access useg/xuseg */
#if defined(TARGET_MIPS64)
    int user_mode = mmu_idx == MIPS_HFLAG_UM;
    int supervisor_mode = mmu_idx == MIPS_HFLAG_SM;
    int kernel_mode = !user_mode && !supervisor_mode;
    int UX = (env->CP0_Status & (1 << CP0St_UX)) != 0;
    int SX = (env->CP0_Status & (1 << CP0St_SX)) != 0;
    int KX = (env->CP0_Status & (1 << CP0St_KX)) != 0;
#endif
    int ret = TLBRET_MATCH;
    /* effective address (modified for KVM T&E kernel segments) */
    target_ulong address = real_address;

#define USEG_LIMIT      ((target_ulong)(int32_t)0x7FFFFFFFUL)
#define KSEG0_BASE      ((target_ulong)(int32_t)0x80000000UL)
#define KSEG1_BASE      ((target_ulong)(int32_t)0xA0000000UL)
#define KSEG2_BASE      ((target_ulong)(int32_t)0xC0000000UL)
#define KSEG3_BASE      ((target_ulong)(int32_t)0xE0000000UL)

#define KVM_KSEG0_BASE  ((target_ulong)(int32_t)0x40000000UL)
#define KVM_KSEG2_BASE  ((target_ulong)(int32_t)0x60000000UL)

#if 0
    if (mips_um_ksegs_enabled()) {
        /* KVM T&E adds guest kernel segments in useg */
        if (real_address >= KVM_KSEG0_BASE) {
            if (real_address < KVM_KSEG2_BASE) {
                /* kseg0 */
                address += KSEG0_BASE - KVM_KSEG0_BASE;
            } else if (real_address <= USEG_LIMIT) {
                /* kseg2/3 */
                address += KSEG2_BASE - KVM_KSEG2_BASE;
            }
        }
    }
#endif

    if (address <= USEG_LIMIT) {
        /* useg */
        uint16_t segctl;

        if (address >= 0x40000000UL) {
            segctl = env->CP0_SegCtl2;
        } else {
            segctl = env->CP0_SegCtl2 >> 16;
        }
        ret = get_segctl_physical_address(env, physical, prot,
                                          real_address, rw, access_type,
                                          mmu_idx, segctl, 0x3FFFFFFF);
#if defined(TARGET_MIPS64)
    } else if (address < 0x4000000000000000ULL) {
        /* xuseg */
        if (UX && address <= (0x3FFFFFFFFFFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0x8000000000000000ULL) {
        /* xsseg */
        if ((supervisor_mode || kernel_mode) &&
            SX && address <= (0x7FFFFFFFFFFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0xC000000000000000ULL) {
        /* xkphys */
        if ((address & 0x07FFFFFFFFFFFFFFULL) <= env->PAMask) {
            /* KX/SX/UX bit to check for each xkphys EVA access mode */
            static const uint8_t am_ksux[8] = {
                [CP0SC_AM_UK]    = (1u << CP0St_KX),
                [CP0SC_AM_MK]    = (1u << CP0St_KX),
                [CP0SC_AM_MSK]   = (1u << CP0St_SX),
                [CP0SC_AM_MUSK]  = (1u << CP0St_UX),
                [CP0SC_AM_MUSUK] = (1u << CP0St_UX),
                [CP0SC_AM_USK]   = (1u << CP0St_SX),
                [6]              = (1u << CP0St_KX),
                [CP0SC_AM_UUSK]  = (1u << CP0St_UX),
            };
            unsigned int am = CP0SC_AM_UK;
            unsigned int xr = (env->CP0_SegCtl2 & CP0SC2_XR_MASK) >> CP0SC2_XR;

            if (xr & (1 << ((address >> 59) & 0x7))) {
                am = (env->CP0_SegCtl1 & CP0SC1_XAM_MASK) >> CP0SC1_XAM;
            }
            /* Does CP0_Status.KX/SX/UX permit the access mode (am) */
            if (env->CP0_Status & am_ksux[am]) {
                ret = get_seg_physical_address(env, physical, prot,
                                               real_address, rw, access_type,
                                               mmu_idx, am, false, env->PAMask,
                                               0);
            } else {
                ret = TLBRET_BADADDR;
            }
        } else {
            ret = TLBRET_BADADDR;
        }
    } else if (address < 0xFFFFFFFF80000000ULL) {
        /* xkseg */
        if (kernel_mode && KX &&
            address <= (0xFFFFFFFF7FFFFFFFULL & env->SEGMask)) {
            ret = env->tlb->map_address(env, physical, prot,
                                        real_address, rw, access_type);
        } else {
            ret = TLBRET_BADADDR;
        }
#endif
    } else if (address < KSEG1_BASE) {
        /* kseg0 */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl1 >> 16, 0x1FFFFFFF);
    } else if (address < KSEG2_BASE) {
        /* kseg1 */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl1, 0x1FFFFFFF);
    } else if (address < KSEG3_BASE) {
        /* sseg (kseg2) */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl0 >> 16, 0x1FFFFFFF);
    } else {
        /*
         * kseg3
         * XXX: debug segment is not emulated
         */
        ret = get_segctl_physical_address(env, physical, prot, real_address, rw,
                                          access_type, mmu_idx,
                                          env->CP0_SegCtl0, 0x1FFFFFFF);
    }
    return ret;
}